

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_lua_generator.cc
# Opt level: O0

void __thiscall
t_lua_generator::generate_lua_struct_reader(t_lua_generator *this,ostream *out,t_struct *tstruct)

{
  t_field *tfield;
  bool bVar1;
  int iVar2;
  int32_t iVar3;
  ostream *poVar4;
  undefined4 extraout_var;
  reference pptVar5;
  t_type *type;
  allocator local_91;
  string local_90;
  string local_60;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_40;
  t_field **local_38;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_30;
  const_iterator f_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *fields;
  t_struct *tstruct_local;
  ostream *out_local;
  t_lua_generator *this_local;
  
  f_iter._M_current = (t_field **)t_struct::get_members(tstruct);
  __gnu_cxx::
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
  __normal_iterator(&local_30);
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,"function ");
  iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
  poVar4 = std::operator<<(poVar4,(string *)CONCAT44(extraout_var,iVar2));
  poVar4 = std::operator<<(poVar4,":read(iprot)");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_up((t_generator *)this);
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,"iprot:readStructBegin()");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,"while true do");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_up((t_generator *)this);
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,"local fname, ftype, fid = iprot:readFieldBegin()");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,"if ftype == TType.STOP then");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_up((t_generator *)this);
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,"break");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  local_38 = (t_field **)
             std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(f_iter._M_current);
  local_30._M_current = local_38;
  while( true ) {
    local_40._M_current =
         (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(f_iter._M_current);
    bVar1 = __gnu_cxx::operator!=(&local_30,&local_40);
    if (!bVar1) break;
    t_generator::indent_down((t_generator *)this);
    poVar4 = t_generator::indent((t_generator *)this,out);
    poVar4 = std::operator<<(poVar4,"elseif fid == ");
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_30);
    iVar3 = t_field::get_key(*pptVar5);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
    poVar4 = std::operator<<(poVar4," then");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_up((t_generator *)this);
    poVar4 = t_generator::indent((t_generator *)this,out);
    poVar4 = std::operator<<(poVar4,"if ftype == ");
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_30);
    type = t_field::get_type(*pptVar5);
    type_to_enum_abi_cxx11_(&local_60,this,type);
    poVar4 = std::operator<<(poVar4,(string *)&local_60);
    poVar4 = std::operator<<(poVar4," then");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_60);
    t_generator::indent_up((t_generator *)this);
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_30);
    tfield = *pptVar5;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_90,"self.",&local_91);
    generate_deserialize_field(this,out,tfield,false,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
    t_generator::indent_down((t_generator *)this);
    poVar4 = t_generator::indent((t_generator *)this,out);
    poVar4 = std::operator<<(poVar4,"else");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    poVar4 = t_generator::indent((t_generator *)this,out);
    poVar4 = std::operator<<(poVar4,"  iprot:skip(ftype)");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    poVar4 = t_generator::indent((t_generator *)this,out);
    poVar4 = std::operator<<(poVar4,"end");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    operator++(&local_30);
  }
  t_generator::indent_down((t_generator *)this);
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,"else");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,"  iprot:skip(ftype)");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,"end");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,"iprot:readFieldEnd()");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_down((t_generator *)this);
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,"end");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,"iprot:readStructEnd()");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_down((t_generator *)this);
  t_generator::indent((t_generator *)this,out);
  std::operator<<(out,"end");
  return;
}

Assistant:

void t_lua_generator::generate_lua_struct_reader(ostream& out, t_struct* tstruct) {
  const vector<t_field*>& fields = tstruct->get_members();
  vector<t_field*>::const_iterator f_iter;

  // function
  indent(out) << endl << endl << "function " << tstruct->get_name() << ":read(iprot)" << endl;
  indent_up();

  indent(out) << "iprot:readStructBegin()" << endl;

  // while: Read in fields
  indent(out) << "while true do" << endl;
  indent_up();

  // if: Check what to read
  indent(out) << "local fname, ftype, fid = iprot:readFieldBegin()" << endl;
  indent(out) << "if ftype == TType.STOP then" << endl;
  indent_up();
  indent(out) << "break" << endl;

  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    indent_down();
    indent(out) << "elseif fid == " << (*f_iter)->get_key() << " then" << endl;
    indent_up();
    indent(out) << "if ftype == " << type_to_enum((*f_iter)->get_type()) << " then" << endl;
    indent_up();

    // Read field contents
    generate_deserialize_field(out, *f_iter, false, "self.");

    indent_down();
    indent(out) << "else" << endl;
    indent(out) << "  iprot:skip(ftype)" << endl;
    indent(out) << "end" << endl;
  }

  // end if
  indent_down();
  indent(out) << "else" << endl;
  indent(out) << "  iprot:skip(ftype)" << endl;
  indent(out) << "end" << endl;
  indent(out) << "iprot:readFieldEnd()" << endl;

  // end while
  indent_down();
  indent(out) << "end" << endl;
  indent(out) << "iprot:readStructEnd()" << endl;

  // end function
  indent_down();
  indent(out);
  out << "end";
}